

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O3

int equal_feed_info(feed_info_t *a,feed_info_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->feed_publisher_name,b->feed_publisher_name);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->feed_publisher_url,b->feed_publisher_url);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->feed_lang,b->feed_lang);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->feed_start_date,b->feed_start_date);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->feed_end_date,b->feed_end_date);
          if (iVar1 == 0) {
            iVar1 = strcmp(a->feed_version,b->feed_version);
            if (iVar1 == 0) {
              iVar1 = strcmp(a->feed_contact_email,b->feed_contact_email);
              if (iVar1 == 0) {
                iVar1 = strcmp(a->feed_contact_url,b->feed_contact_url);
                uVar2 = (uint)(iVar1 == 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_feed_info(const feed_info_t *a, const feed_info_t *b) {
    return (!strcmp(a->feed_publisher_name, b->feed_publisher_name) &&
             !strcmp(a->feed_publisher_url, b->feed_publisher_url) &&
             !strcmp(a->feed_lang, b->feed_lang) &&
             !strcmp(a->feed_start_date, b->feed_start_date) &&
             !strcmp(a->feed_end_date, b->feed_end_date) &&
             !strcmp(a->feed_version, b->feed_version) &&
             !strcmp(a->feed_contact_email, b->feed_contact_email) &&
             !strcmp(a->feed_contact_url, b->feed_contact_url));
}